

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_build_rwkv7_base::build_rwkv7_channel_mix
          (llm_build_rwkv7_base *this,llama_layer *layer,ggml_tensor *cur,ggml_tensor *x_prev,
          llm_arch arch)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  undefined8 uVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  int in_R8D;
  llm_graph_context *unaff_retaddr;
  ggml_tensor *k;
  ggml_tensor *xk;
  ggml_tensor *sx;
  
  pgVar5 = in_RDI;
  uVar3 = ggml_sub(in_RDI->src[5],in_RCX,in_RDX);
  if (in_R8D == 0x3a) {
    pgVar1 = in_RDI->src[5];
    uVar3 = ggml_mul(in_RDI->src[5],uVar3,in_RSI[2].view_offs);
    ggml_add(pgVar1,uVar3,in_RDX);
    pgVar1 = in_RDI->src[5];
    pgVar2 = in_RDI->src[5];
    pgVar4 = llm_graph_context::build_lora_mm(unaff_retaddr,pgVar5,in_RSI);
    uVar3 = ggml_relu(pgVar2,pgVar4);
    ggml_sqr(pgVar1,uVar3);
    pgVar5 = llm_graph_context::build_lora_mm(unaff_retaddr,pgVar5,in_RSI);
    return pgVar5;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2e10,"fatal error");
}

Assistant:

ggml_tensor * build_rwkv7_channel_mix(
            const llama_layer * layer,
            ggml_tensor * cur,
            ggml_tensor * x_prev,
            llm_arch arch) const {
        ggml_tensor * sx = ggml_sub(ctx0, x_prev, cur);
        switch (arch) {
            case LLM_ARCH_RWKV7:
                {
                    ggml_tensor * xk = ggml_add(ctx0, ggml_mul(ctx0, sx, layer->channel_mix_lerp_k), cur);

                    ggml_tensor * k = ggml_sqr(
                        ctx0,
                        ggml_relu(
                            ctx0,
                            build_lora_mm(layer->channel_mix_key, xk)
                        )
                    );

                    cur = build_lora_mm(layer->channel_mix_value, k);
                } break;
            default:
                GGML_ABORT("fatal error");
        }

        return cur;
    }